

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O2

void luaE_setdebt(global_State *g,l_mem debt)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = g->GCtotalbytes - g->GCdebt;
  uVar2 = uVar1 ^ 0x7fffffffffffffff;
  if (debt <= (long)uVar2) {
    uVar2 = debt;
  }
  g->GCtotalbytes = uVar1 + uVar2;
  g->GCdebt = uVar2;
  return;
}

Assistant:

void luaE_setdebt (global_State *g, l_mem debt) {
  l_mem tb = gettotalbytes(g);
  lua_assert(tb > 0);
  if (debt > MAX_LMEM - tb)
    debt = MAX_LMEM - tb;  /* will make GCtotalbytes == MAX_LMEM */
  g->GCtotalbytes = tb + debt;
  g->GCdebt = debt;
}